

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O0

RepeatedField<absl::lts_20250127::Cord> * __thiscall
google::protobuf::Reflection::GetRaw<google::protobuf::RepeatedField<absl::lts_20250127::Cord>>
          (Reflection *this,Message *message,FieldDescriptor *field)

{
  bool bVar1;
  uint32_t offset;
  LogMessage *pLVar2;
  bool local_89;
  uint32_t field_offset;
  Voidify local_69;
  string_view local_68;
  byte local_41;
  LogMessage local_40;
  Voidify local_29;
  FieldDescriptor *local_28;
  FieldDescriptor *field_local;
  Message *message_local;
  Reflection *this_local;
  
  local_28 = field;
  field_local = (FieldDescriptor *)message;
  message_local = (Message *)this;
  VerifyFieldType<google::protobuf::RepeatedField<absl::lts_20250127::Cord>>(this,field);
  bVar1 = internal::ReflectionSchema::InRealOneof(&this->schema_,local_28);
  local_41 = 0;
  local_89 = true;
  if (bVar1) {
    local_89 = HasOneofField(this,(Message *)field_local,local_28);
  }
  if (((local_89 ^ 0xffU) & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message.h"
               ,0x704,"!schema_.InRealOneof(field) || HasOneofField(message, field)");
    local_41 = 1;
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_40);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar2,(char (*) [9])"Field = ");
    local_68 = FieldDescriptor::full_name(local_28);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar2,local_68);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_29,pLVar2);
  }
  if ((local_41 & 1) == 0) {
    bVar1 = internal::ReflectionSchema::InRealOneof(&this->schema_,local_28);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      bVar1 = internal::ReflectionSchema::IsSplit(&this->schema_,local_28);
      if (bVar1) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&field_offset,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message.h"
                   ,0x70c,"!schema_.IsSplit(field)");
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream
                           ((LogMessage *)&field_offset);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_69,pLVar2);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&field_offset);
      }
      offset = internal::ReflectionSchema::GetFieldOffset(&this->schema_,local_28);
      this_local = (Reflection *)
                   internal::
                   GetConstRefAtOffset<google::protobuf::RepeatedField<absl::lts_20250127::Cord>>
                             ((Message *)field_local,offset);
    }
    else {
      this_local = (Reflection *)
                   GetRawNonOneof<google::protobuf::RepeatedField<absl::lts_20250127::Cord>>
                             (this,(Message *)field_local,local_28);
    }
    return (RepeatedField<absl::lts_20250127::Cord> *)this_local;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_40);
}

Assistant:

const Type& Reflection::GetRaw(const Message& message,
                               const FieldDescriptor* field) const {
  VerifyFieldType<Type>(field);
  ABSL_DCHECK(!schema_.InRealOneof(field) || HasOneofField(message, field))
      << "Field = " << field->full_name();

  if (ABSL_PREDICT_TRUE(!schema_.InRealOneof(field))) {
    return GetRawNonOneof<Type>(message, field);
  }

  // Oneof fields are not split.
  ABSL_DCHECK(!schema_.IsSplit(field));

  const uint32_t field_offset = schema_.GetFieldOffset(field);
  return internal::GetConstRefAtOffset<Type>(message, field_offset);
}